

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O3

void __thiscall
miniros::master::Master::Master(Master *this,shared_ptr<miniros::RPCManager> *manager)

{
  RegistrationManager *this_00;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  RPCManagerPtr local_58;
  _Any_data __tmp;
  
  this->m_port = -1;
  local_60 = &(this->m_host).field_2;
  (this->m_host)._M_dataplus._M_p = (pointer)local_60;
  (this->m_host)._M_string_length = 0;
  (this->m_host).field_2._M_local_buf[0] = '\0';
  (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->m_regManager;
  RegistrationManager::RegistrationManager(this_00);
  local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (manager->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (manager->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  MasterHandler::MasterHandler(&this->m_handler,&local_58,this_00);
  if (local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ParameterStorage::ParameterStorage(&this->m_parameterStorage,this_00);
  (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (manager->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_rpcManager).
              super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(manager->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  ::std::__cxx11::string::_M_replace
            ((ulong)&this->m_host,0,(char *)(this->m_host)._M_string_length,0x257652);
  this->m_port = 0x2c2f;
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (Master::loc.initialized_ == false) {
    local_88._M_unused._M_object = &local_78;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"miniros.unknown_package","");
    console::initializeLogLocation(&Master::loc,(string *)&local_88,Warn);
    if ((_Manager_type *)local_88._M_unused._0_8_ != &local_78) {
      operator_delete(local_88._M_unused._M_object,(ulong)(local_78 + 1));
    }
  }
  if (Master::loc.level_ != Warn) {
    console::setLogLocationLevel(&Master::loc,Warn);
    console::checkLogLocationEnabled(&Master::loc);
  }
  if (Master::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,Master::loc.logger_,Master::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                   ,0x17,"miniros::master::Master::Master(std::shared_ptr<RPCManager>)",
                   "Invalid XMLRPC uri. Using ROS_MASTER_URI=http://%s:%d",
                   (this->m_host)._M_dataplus._M_p,(ulong)(uint)this->m_port);
  }
  __tmp._8_4_ = 0;
  __tmp._12_4_ = 0;
  local_88._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor;
  local_88._8_8_ =
       *(undefined8 *)
        ((long)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor + 8);
  *(Master **)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor = this;
  *(undefined4 *)
   ((long)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)
   ((long)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor + 0xc) = 0;
  local_78 = (this->m_parameterStorage).paramUpdateFn.super__Function_base._M_manager;
  (this->m_parameterStorage).paramUpdateFn.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(const_std::shared_ptr<miniros::master::NodeRef>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_XmlRpc::XmlRpcValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp:27:5)>
       ::_M_manager;
  local_70 = (this->m_parameterStorage).paramUpdateFn._M_invoker;
  (this->m_parameterStorage).paramUpdateFn._M_invoker =
       ::std::
       _Function_handler<void_(const_std::shared_ptr<miniros::master::NodeRef>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_XmlRpc::XmlRpcValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp:27:5)>
       ::_M_invoke;
  if (local_78 != (_Manager_type)0x0) {
    __tmp._M_unused._M_object = this;
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  return;
}

Assistant:

Master::Master(std::shared_ptr<RPCManager> manager)
  : m_handler(manager, &m_regManager), m_parameterStorage(&m_regManager)
{
  m_rpcManager = manager;
  // TODO: Read environment.
  // split the URI (if it's valid) into host and port
  // if (!network.splitURI(ROS.ROS_MASTER_URI, ref _host, ref _port))
  {
    m_host = "localhost";
    m_port = 11311;
    MINIROS_WARN("Invalid XMLRPC uri. Using ROS_MASTER_URI=http://%s:%d", m_host.c_str(), m_port);
  }

  m_parameterStorage.paramUpdateFn =
    [this] (const std::shared_ptr<NodeRef>& nr, const std::string& fullPath, const RpcValue* value) {
      this->m_handler.sendToNode(nr, "paramUpdate", fullPath, value ? *value : RpcValue::Dict());
    };
}